

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O2

pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *
__thiscall
anurbs::NurbsSurfaceGeometry<2L>::shape_functions_at
          (pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
           *__return_storage_ptr__,NurbsSurfaceGeometry<2L> *this,double u,double v,Index order)

{
  PointerType dataPtr;
  long lVar1;
  Index IVar2;
  Index IVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer plVar6;
  Index j;
  long lVar7;
  Index i;
  long lVar8;
  vector<long,_std::allocator<long>_> indices;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> weights;
  NurbsSurfaceShapeFunction shape_function;
  _Vector_base<long,_std::allocator<long>_> local_2b8;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_2a0;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_260;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_238;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_210;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_1e8;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_1c0;
  NurbsSurfaceShapeFunction local_180;
  
  iVar4 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
  iVar5 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
  NurbsSurfaceShapeFunction::NurbsSurfaceShapeFunction
            (&local_180,CONCAT44(extraout_var,iVar4),CONCAT44(extraout_var_00,iVar5),order);
  if ((this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows == 0) {
    knots_u(&local_238,this);
    knots_v(&local_260,this);
    NurbsSurfaceShapeFunction::compute(&local_180,&local_238,&local_260,u,v);
    free(local_260.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
         .m_data);
    local_1e8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = local_238.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
  }
  else {
    dataPtr = (this->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    lVar8 = (this->m_knots_u).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    iVar4 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
    lVar7 = (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    iVar5 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
    Eigen::
    MapBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>
    ::MapBase((MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               *)&local_2a0,dataPtr,(lVar8 - CONCAT44(extraout_var_01,iVar4)) + 1,
              (lVar7 - CONCAT44(extraout_var_02,iVar5)) + 1);
    knots_u(&local_1e8,this);
    knots_v(&local_210,this);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::Stride<0,0>>>
              ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_1c0,
               (DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_2a0,(type *)0x0);
    NurbsSurfaceShapeFunction::compute(&local_180,&local_1e8,&local_210,&local_1c0,u,v);
    free(local_1c0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
         m_storage.m_data);
    free(local_210.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
         .m_data);
  }
  free(local_1e8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_2b8,
             (local_180.m_shape_v.m_degree + 1) * (local_180.m_shape_u.m_degree + 1),
             (allocator_type *)&local_2a0);
  plVar6 = local_2b8._M_impl.super__Vector_impl_data._M_start;
  for (lVar8 = 0; lVar8 <= local_180.m_shape_u.m_degree; lVar8 = lVar8 + 1) {
    for (lVar7 = 0; IVar3 = local_180.m_first_nonzero_pole_v,
        IVar2 = local_180.m_first_nonzero_pole_u, lVar7 <= local_180.m_shape_v.m_degree;
        lVar7 = lVar7 + 1) {
      (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])(this);
      lVar1 = (this->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      iVar4 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])(this);
      *plVar6 = IVar3 + lVar7 + (IVar2 + lVar8) * ((lVar1 - CONCAT44(extraout_var_03,iVar4)) + 1);
      plVar6 = plVar6 + 1;
    }
  }
  NurbsSurfaceShapeFunction::values(&local_2a0,&local_180);
  std::pair<std::vector<long,_std::allocator<long>_>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::
  pair<std::vector<long,_std::allocator<long>_>_&,_Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_true>
            (__return_storage_ptr__,(vector<long,_std::allocator<long>_> *)&local_2b8,&local_2a0);
  free(local_2a0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
       .m_data);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_2b8);
  NurbsSurfaceShapeFunction::~NurbsSurfaceShapeFunction(&local_180);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<Index>, Eigen::MatrixXd>
    shape_functions_at(const double u, const double v, const Index order) const
    {
        NurbsSurfaceShapeFunction shape_function(degree_u(), degree_v(), order);

        if (is_rational()) {
            Eigen::Map<const Eigen::MatrixXd> weights(m_weights.data(), nb_poles_u(), nb_poles_v());
            shape_function.compute(knots_u(), knots_v(), weights, u, v);
        } else {
            shape_function.compute(knots_u(), knots_v(), u, v);
        }

        std::vector<Index> indices(shape_function.nb_nonzero_poles());
        auto it = indices.begin();

        for (Index i = 0; i < shape_function.nb_nonzero_poles_u(); i++) {
            for (Index j = 0; j < shape_function.nb_nonzero_poles_v(); j++) {
                const Index pole_u = shape_function.first_nonzero_pole_u() + i;
                const Index pole_v = shape_function.first_nonzero_pole_v() + j;

                Index poleIndex = Math::single_index(nb_poles_u(), nb_poles_v(), pole_u, pole_v);

                *(it++) = poleIndex;
            }
        }

        return {indices, shape_function.values()};
    }